

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLookupResultValid
               (Texture2DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FilterMode FVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int coordZ;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  Vec2 local_78;
  Vec2 *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  Vec2 local_38;
  
  if (texture->m_numLevels < 1) {
    iVar7 = -1;
  }
  else {
    iVar7 = (texture->m_levels->m_size).m_data[2] + -1;
  }
  local_58 = CONCAT44(local_58._4_4_,coord->m_data[2]);
  local_70 = lodBounds;
  local_48 = TexVerifierUtil::computeFloatingPointError
                       (coord->m_data[2],(prec->coordBits).m_data[2]);
  fVar8 = floorf(((float)local_58 - local_48) + 0.5);
  iVar6 = (int)fVar8;
  fVar8 = ceilf((float)local_58 + local_48 + 0.5);
  iVar2 = (int)fVar8 + -1;
  coordZ = iVar7;
  if (iVar6 < iVar7) {
    coordZ = iVar6;
  }
  if (iVar6 < 0) {
    coordZ = 0;
  }
  if (iVar2 < iVar7) {
    iVar7 = iVar2;
  }
  if (iVar2 < 0) {
    iVar7 = 0;
  }
  local_78.m_data = *(float (*) [2])coord->m_data;
  if (coordZ <= iVar7) {
    local_58 = *(undefined8 *)local_70->m_data;
    local_48 = (float)((ulong)local_58 >> 0x20);
    uStack_50 = 0;
    fVar8 = sampler->lodThreshold;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    fVar9 = ceilf((float)local_58 + 0.5);
    local_64 = (int)fVar9 + -1;
    fVar9 = floorf(local_48 + 0.5);
    local_68 = (int)fVar9;
    fVar9 = floorf((float)local_58);
    local_70 = (Vec2 *)CONCAT44(local_70._4_4_,(int)fVar9);
    fVar9 = floorf(local_48);
    local_60 = (int)fVar9;
    local_5c = iVar7;
    do {
      if (((float)local_58 <= fVar8) &&
         (bVar1 = isLevelSampleResultValid
                            (texture->m_levels,sampler,sampler->magFilter,prec,&local_78,coordZ,
                             result), bVar1)) {
        return true;
      }
      if (fVar8 < local_48) {
        FVar4 = sampler->minFilter;
        iVar7 = texture->m_numLevels + -1;
        if (iVar7 < 1 || (FVar4 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
          if ((FVar4 == LINEAR_MIPMAP_NEAREST) || (FVar4 == NEAREST_MIPMAP_NEAREST)) {
            iVar2 = iVar7;
            if (local_64 < iVar7) {
              iVar2 = local_64;
            }
            if (local_64 < 0) {
              iVar2 = 0;
            }
            if (local_68 < iVar7) {
              iVar7 = local_68;
            }
            if (local_68 < 0) {
              iVar7 = 0;
            }
            for (; iVar2 <= iVar7; iVar2 = iVar2 + 1) {
              uVar3 = sampler->minFilter - LINEAR;
              FVar4 = NEAREST;
              if (uVar3 < 5) {
                FVar4 = *(FilterMode *)(&DAT_00b7e380 + (ulong)uVar3 * 4);
              }
              bVar1 = isLevelSampleResultValid
                                (texture->m_levels + iVar2,sampler,FVar4,prec,&local_78,coordZ,
                                 result);
              if (bVar1) {
                return true;
              }
            }
          }
          else {
            bVar1 = isLevelSampleResultValid
                              (texture->m_levels,sampler,FVar4,prec,&local_78,coordZ,result);
            if (bVar1) {
              return true;
            }
          }
        }
        else {
          iVar2 = texture->m_numLevels + -2;
          iVar7 = iVar2;
          if ((int)local_70 < iVar2) {
            iVar7 = (int)local_70;
          }
          if ((int)local_70 < 0) {
            iVar7 = 0;
          }
          if (local_60 < iVar2) {
            iVar2 = local_60;
          }
          if (local_60 < 0) {
            iVar2 = 0;
          }
          while (iVar7 <= iVar2) {
            uVar3 = sampler->minFilter - LINEAR;
            FVar4 = NEAREST;
            if (uVar3 < 5) {
              FVar4 = *(FilterMode *)(&DAT_00b7e380 + (ulong)uVar3 * 4);
            }
            fVar9 = (float)iVar7;
            auVar10._4_4_ = local_58._4_4_ - fVar9;
            auVar10._0_4_ = (float)local_58 - fVar9;
            auVar10._8_4_ = (float)uStack_50 - fVar9;
            auVar10._12_4_ = uStack_50._4_4_ - fVar9;
            auVar10 = minps(_DAT_00ad8ca0,auVar10);
            lVar5 = (long)iVar7;
            iVar7 = iVar7 + 1;
            local_38.m_data[1] = (float)(-(uint)(0.0 <= local_58._4_4_ - fVar9) & auVar10._4_4_);
            local_38.m_data[0] = (float)(-(uint)(0.0 <= (float)local_58 - fVar9) & auVar10._0_4_);
            bVar1 = isMipmapLinearSampleResultValid
                              (texture->m_levels + lVar5,texture->m_levels + iVar7,sampler,FVar4,
                               prec,&local_78,coordZ,&local_38,result);
            if (bVar1) {
              return true;
            }
          }
        }
      }
      coordZ = coordZ + 1;
    } while (coordZ <= local_5c);
  }
  return false;
}

Assistant:

bool isLookupResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.z(), coord.z());
	const Vec2		coordXY			= coord.swizzle(0,1);
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordXY, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordXY, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordXY, layer, result))
					return true;
			}
		}
	}

	return false;
}